

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VertexClustering::VertexClustering(VertexClustering *this,Options *opts)

{
  undefined8 uVar1;
  void *pvVar2;
  ulong uVar3;
  size_type sVar4;
  value_type pVVar5;
  reference ppVVar6;
  undefined8 *in_RSI;
  VertexGroup *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  undefined8 in_stack_ffffffffffffff68;
  VCClusterAnisoQuad *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  VCClusterAniso *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<VCCluster_*,_std::allocator<VCCluster_*>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  VCCluster *in_stack_ffffffffffffffa0;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  
  std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::vector
            ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)0x27fc22);
  std::map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::map
            ((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
              *)0x27fc35);
  std::queue<VCEdge,std::deque<VCEdge,std::allocator<VCEdge>>>::
  queue<std::deque<VCEdge,std::allocator<VCEdge>>,void>
            ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)
             in_stack_ffffffffffffff70);
  *(undefined8 *)&in_RDI->field_0xa8 = 0;
  srand(*(uint *)(in_RSI + 2));
  if ((*(byte *)((long)in_RSI + 9) & 1) != 0) {
    *(undefined1 *)(in_RSI + 1) = 1;
  }
  *(undefined8 *)&in_RDI->field_0xd0 = in_RSI[2];
  uVar1 = in_RSI[1];
  *(undefined8 *)&in_RDI->field_0xc0 = *in_RSI;
  *(undefined8 *)&in_RDI->field_0xc8 = uVar1;
  pvVar2 = operator_new(0x4c4b410);
  VertexGroup::VertexGroup(in_RDI);
  *(void **)in_RDI = pvVar2;
  *(undefined8 *)&in_RDI->field_0x8 = 0;
  *(undefined8 *)&in_RDI->field_0xb0 = 0x4066800000000000;
  *(undefined8 *)&in_RDI->field_0xb8 = 0x4059000000000000;
  std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if ((*(byte *)((long)in_RSI + 9) & 1) == 0) {
    if ((*(byte *)((long)in_RSI + 10) & 1) == 0) {
      local_2c = 0;
      while( true ) {
        uVar3 = (ulong)local_2c;
        sVar4 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::size
                          ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)&in_RDI->field_0x10)
        ;
        if (sVar4 <= uVar3) break;
        pVVar5 = (value_type)operator_new(0xf0);
        VCCluster::VCCluster
                  (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        ppVVar6 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                            ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)
                             &in_RDI->field_0x10,(long)local_2c);
        *ppVVar6 = pVVar5;
        local_2c = local_2c + 1;
      }
    }
    else {
      local_28 = 0;
      while( true ) {
        uVar3 = (ulong)local_28;
        sVar4 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::size
                          ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)&in_RDI->field_0x10)
        ;
        if (sVar4 <= uVar3) break;
        pVVar5 = (value_type)operator_new(0x100);
        VCClusterQuad::VCClusterQuad
                  ((VCClusterQuad *)in_stack_ffffffffffffff70,
                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        ppVVar6 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                            ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)
                             &in_RDI->field_0x10,(long)local_28);
        *ppVVar6 = pVVar5;
        local_28 = local_28 + 1;
      }
    }
  }
  else if ((*(byte *)((long)in_RSI + 10) & 1) == 0) {
    local_24 = 0;
    while( true ) {
      uVar3 = (ulong)local_24;
      sVar4 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::size
                        ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)&in_RDI->field_0x10);
      if (sVar4 <= uVar3) break;
      pVVar5 = (value_type)operator_new(0x150);
      VCClusterAniso::VCClusterAniso
                (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      ppVVar6 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                          ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)&in_RDI->field_0x10,
                           (long)local_24);
      *ppVVar6 = pVVar5;
      local_24 = local_24 + 1;
    }
  }
  else {
    local_20 = 0;
    while( true ) {
      uVar3 = (ulong)local_20;
      sVar4 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::size
                        ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)&in_RDI->field_0x10);
      if (sVar4 <= uVar3) break;
      pVVar5 = (value_type)operator_new(0x160);
      VCClusterAnisoQuad::VCClusterAnisoQuad
                (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      ppVVar6 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                          ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)&in_RDI->field_0x10,
                           (long)local_20);
      *ppVVar6 = pVVar5;
      local_20 = local_20 + 1;
    }
  }
  ppVVar6 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                      ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)&in_RDI->field_0x10,0);
  (*ppVVar6)->isNull = true;
  return;
}

Assistant:

VertexClustering::VertexClustering(VertexClustering::Options &opts): cntFace(0)
{
	srand(opts.seed);
	if (opts.anisotropic) {
		opts.adaptive = true;
	}
	this->opts = opts;
	vGroup = new VertexGroup();
	vGroupNew = NULL;
	angle_min = 180;
	angle_less_30 = 100;
	clusters.resize(opts.numCluster + 1); 
	if (opts.anisotropic) {
		if (opts.quadMetric) {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterAnisoQuad(i);
		}
		else {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterAniso(i);
		}
	}
	else
		if (opts.quadMetric) {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterQuad(i);
		}
		else {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCCluster(i);
		}
	clusters[0]->isNull = true;
}